

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void unique_ptr_test(void)

{
  unique_ptr<Xxx> uVar1;
  Xxx *pXVar2;
  ostream *poVar3;
  long in_FS_OFFSET;
  bool bVar4;
  vector<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_> PtrVec;
  vector<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_> local_48;
  Xxx *local_28;
  unique_ptr<Xxx> local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.px = (Xxx *)0x0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"unique_ptr_test: in\n",0x14);
  if (local_20.px != (Xxx *)0x0) {
    abort();
  }
  pXVar2 = (Xxx *)operator_new(0x10);
  Xxx::Xxx(pXVar2,0x400);
  local_28 = pXVar2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"yPtr=",5);
  poVar3 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  Xxx::doSomething(pXVar2);
  uVar1.px = local_20.px;
  local_28 = (Xxx *)0x0;
  bVar4 = local_20.px != (Xxx *)0x0;
  local_20.px = pXVar2;
  if (bVar4) {
    Xxx::~Xxx(uVar1.px);
  }
  operator_delete(uVar1.px,0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"xPtr=",5);
  poVar3 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"yPtr=",5);
  poVar3 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_48.super__Vector_base<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unique_ptr<Xxx>,std::allocator<unique_ptr<Xxx>>>::
  _M_realloc_insert<unique_ptr<Xxx>const&>
            ((vector<unique_ptr<Xxx>,std::allocator<unique_ptr<Xxx>>> *)&local_48,(iterator)0x0,
             &local_20);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"xPtr=",5);
  poVar3 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::vector<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>::~vector(&local_48);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"xPtr=",5);
  poVar3 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_48.super__Vector_base<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unique_ptr<Xxx>,std::allocator<unique_ptr<Xxx>>>::
  _M_realloc_insert<unique_ptr<Xxx>const&>
            ((vector<unique_ptr<Xxx>,std::allocator<unique_ptr<Xxx>>> *)&local_48,(iterator)0x0,
             &local_20);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"PtrList.back=",0xd);
  poVar3 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"xPtr=",5);
  poVar3 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  uVar1.px = local_20.px;
  pXVar2 = local_48.super__Vector_base<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].px;
  local_48.super__Vector_base<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>._M_impl.
  super__Vector_impl_data._M_finish[-1].px = (Xxx *)0x0;
  bVar4 = local_20.px != (Xxx *)0x0;
  local_20.px = pXVar2;
  if (bVar4) {
    Xxx::~Xxx(uVar1.px);
  }
  operator_delete(uVar1.px,0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"xPtr=",5);
  poVar3 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::vector<unique_ptr<Xxx>,_std::allocator<unique_ptr<Xxx>_>_>::~vector(&local_48);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"xPtr=",5);
  poVar3 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"unique_ptr_test: out\n",0x15);
  uVar1.px = local_20.px;
  if (local_20.px != (Xxx *)0x0) {
    Xxx::~Xxx(local_20.px);
  }
  operator_delete(uVar1.px,0x10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void unique_ptr_test(void)
{
    // Create an empty (ie. NULL) unique_ptr
    unique_ptr<Xxx> xPtr;

    std::cout << "unique_ptr_test: in\n";

    if (xPtr) // empty pointer
    {
        abort(); // impossible
    }
    else
    {
        // Create a new Xxx object, and give its ownership to the yPtr unique_ptr
        unique_ptr<Xxx> yPtr(new Xxx(1024));
        // Same as :
        //unique_ptr<Xxx> yPtr;
        //yPtr.reset(new Xxx(1024));

        std::cout << "yPtr=" << yPtr.get() << std::endl;
        if (yPtr) // valid pointer
        {
            // Access members functions/variables like with a raw pointer
            yPtr->doSomething();
        }
        else
        {
            abort(); // impossible
        }

        // Transfer ownership by making a copy of the unique_ptr
        xPtr = move(yPtr);
        std::cout << "xPtr=" << xPtr.get() << std::endl;
        std::cout << "yPtr=" << yPtr.get() << std::endl;

        std::vector<unique_ptr<Xxx> > PtrVec;
        PtrVec.push_back(xPtr);
        std::cout << "xPtr=" << xPtr.get() << std::endl;

    } // yPtr is destroyed, but xPtr retains the ownership of the object

    std::cout << "xPtr=" << xPtr.get() << std::endl;

    {
        std::vector<unique_ptr<Xxx> > PtrList;
        PtrList.push_back(move(xPtr)); // Transfer ownership to the vector

        std::cout << "PtrList.back=" << PtrList.back().get() << std::endl;
        std::cout << "xPtr=" << xPtr.get() << std::endl;

        xPtr = PtrList.back(); // Get back ownership from the vector

        std::cout << "xPtr=" << xPtr.get() << std::endl;
    }

    std::cout << "xPtr=" << xPtr.get() << std::endl;

    std::cout << "unique_ptr_test: out\n";

    // Same as :
    //xPtr.reset();
}